

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::isModuleCommonDecl(SyntaxKind kind)

{
  SyntaxKind in_EDI;
  bool local_1;
  
  if ((((in_EDI == ClockingDeclaration) || (in_EDI == DefaultClockingReference)) ||
      (in_EDI == DefaultDisableDeclaration)) || (in_EDI == GenvarDeclaration)) {
    local_1 = true;
  }
  else {
    local_1 = isModuleOrPackageDecl(in_EDI);
  }
  return local_1;
}

Assistant:

static bool isModuleCommonDecl(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::GenvarDeclaration:
        case SyntaxKind::ClockingDeclaration:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
            return true;
        default:
            return isModuleOrPackageDecl(kind);
    }
}